

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception-test.c++
# Opt level: O1

void __thiscall kj::_::anon_unknown_0::TestCase135::run(TestCase135 *this)

{
  bool bVar1;
  bool bVar2;
  undefined4 *puVar3;
  bool failure;
  bool success;
  DebugExpression<bool> _kjCondition;
  UnwindDetector _kjUnwindDetector140;
  UnwindDetector _kjUnwindDetector141;
  bool local_2a;
  DebugExpression<bool> local_29;
  DebugExpression<bool_&> local_28;
  UnwindDetector local_1c;
  
  local_2a = false;
  UnwindDetector::UnwindDetector((UnwindDetector *)&local_28);
  UnwindDetector::UnwindDetector(&local_1c);
  local_29.value = (bool)(local_2a ^ 1);
  if ((local_2a != false) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[28],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception-test.c++"
               ,0x8f,ERROR,"\"failed: expected \" \"!(success)\", _kjCondition",
               (char (*) [28])"failed: expected !(success)",&local_29);
  }
  local_29.value = true;
  bVar1 = UnwindDetector::isUnwinding(&local_1c);
  bVar2 = UnwindDetector::isUnwinding((UnwindDetector *)&local_28);
  if (!bVar2) {
    local_2a = true;
  }
  local_28.value = &local_2a;
  if ((local_2a == false) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[25],kj::_::DebugExpression<bool&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception-test.c++"
               ,0x93,ERROR,"\"failed: expected \" \"success\", _kjCondition",
               (char (*) [25])"failed: expected success",&local_28);
  }
  local_28.value = (bool *)(CONCAT71(local_28.value._1_7_,bVar1) ^ 1);
  if ((bVar1) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[28],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception-test.c++"
               ,0x94,ERROR,"\"failed: expected \" \"!(failure)\", _kjCondition",
               (char (*) [28])"failed: expected !(failure)",(DebugExpression<bool> *)&local_28);
  }
  local_2a = false;
  UnwindDetector::UnwindDetector((UnwindDetector *)&local_28);
  UnwindDetector::UnwindDetector(&local_1c);
  local_29.value = (bool)(local_2a ^ 1);
  if ((local_2a != false) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[28],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception-test.c++"
               ,0x9d,ERROR,"\"failed: expected \" \"!(success)\", _kjCondition",
               (char (*) [28])"failed: expected !(success)",&local_29);
  }
  local_29.value = true;
  puVar3 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar3 = 1;
  __cxa_throw(puVar3,&int::typeinfo,0);
}

Assistant:

TEST(Exception, ScopeSuccessFail) {
  bool success = false;
  bool failure = false;

  {
    KJ_ON_SCOPE_SUCCESS(success = true);
    KJ_ON_SCOPE_FAILURE(failure = true);

    EXPECT_FALSE(success);
    EXPECT_FALSE(failure);
  }

  EXPECT_TRUE(success);
  EXPECT_FALSE(failure);

  success = false;
  failure = false;

  try {
    KJ_ON_SCOPE_SUCCESS(success = true);
    KJ_ON_SCOPE_FAILURE(failure = true);

    EXPECT_FALSE(success);
    EXPECT_FALSE(failure);

    throw 1;
  } catch (int) {}

  EXPECT_FALSE(success);
  EXPECT_TRUE(failure);
}